

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtil.h
# Opt level: O0

void TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
               (CGraph *cg,Parameters *params,Count true_triangle_count,
               _func_Estimates_CGraph_ptr_Parameters *func)

{
  EstimatorStats est_stats_00;
  EstimatorStats est_stats_01;
  FILE *pFVar1;
  pointer pEVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  undefined8 uVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  Parameters local_6c0;
  string local_618;
  Parameters local_5f8;
  FILE *local_550;
  FILE *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  uint local_404;
  undefined1 local_400 [8];
  string mkdir;
  DIR *dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  string directory;
  string out_filename;
  string current_time;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  double dStack_300;
  Parameters local_2f8;
  string local_250;
  Parameters local_230;
  vector<Estimates,_std::allocator<Estimates>_> local_188;
  undefined1 auStack_170 [8];
  EstimatorStats est_stats;
  time_point endTime;
  Parameters local_118;
  undefined1 local_70 [8];
  Estimates est;
  time_point startTime;
  Count i;
  vector<Estimates,_std::allocator<Estimates>_> estimates;
  _func_Estimates_CGraph_ptr_Parameters *func_local;
  Count true_triangle_count_local;
  Parameters *params_local;
  CGraph *cg_local;
  
  estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)func;
  std::vector<Estimates,_std::allocator<Estimates>_>::vector
            ((vector<Estimates,_std::allocator<Estimates>_> *)&i);
  for (startTime.__d.__r = (duration)0; (long)startTime.__d.__r < (long)params->no_of_repeat;
      startTime.__d.__r = (duration)((long)startTime.__d.__r + 1)) {
    est.query_complexity = (double)std::chrono::_V2::system_clock::now();
    pEVar2 = estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    Parameters::Parameters(&local_118,params);
    (*(code *)pEVar2)(local_70,cg,&local_118);
    Parameters::~Parameters(&local_118);
    est_stats.query_complexity_max_percentage = (double)std::chrono::_V2::system_clock::now();
    std::vector<Estimates,_std::allocator<Estimates>_>::push_back
              ((vector<Estimates,_std::allocator<Estimates>_> *)&i,(value_type *)local_70);
  }
  std::vector<Estimates,_std::allocator<Estimates>_>::vector
            (&local_188,(vector<Estimates,_std::allocator<Estimates>_> *)&i);
  GetErrorStatistics((EstimatorStats *)auStack_170,&local_188,true_triangle_count);
  std::vector<Estimates,_std::allocator<Estimates>_>::~vector(&local_188);
  pFVar1 = _stdout;
  if ((params->print_to_console & 1U) != 0) {
    Parameters::Parameters(&local_230,params);
    WriteHeaderInOutput(pFVar1,&local_230,cg,true_triangle_count);
    Parameters::~Parameters(&local_230);
    pFVar1 = _stdout;
    std::__cxx11::string::string((string *)&local_250,(string *)&params->algo_name);
    Parameters::Parameters(&local_2f8,params);
    memcpy((void *)((long)&current_time.field_2 + 8),auStack_170,0x40);
    est_stats_00.mean_error_percentage = (double)uStack_330;
    est_stats_00._0_8_ = current_time.field_2._8_8_;
    est_stats_00.median_error_percentage = (double)local_328;
    est_stats_00.stddev_error_percentage = (double)uStack_320;
    est_stats_00.max_error_percentage = (double)local_318;
    est_stats_00.vertices_seen_max_percentage = (double)uStack_310;
    est_stats_00.edges_seen_max_percentage = (double)local_308;
    est_stats_00.query_complexity_max_percentage = dStack_300;
    WriteAlgorithmOutput(pFVar1,&local_250,&local_2f8,est_stats_00);
    Parameters::~Parameters(&local_2f8);
    std::__cxx11::string::~string((string *)&local_250);
    WriteRawData(_stdout,(vector<Estimates,_std::allocator<Estimates>_> *)&i);
  }
  if ((params->print_to_file & 1U) != 0) {
    GetTimestamp_abi_cxx11_();
    std::__cxx11::string::find_last_of((char *)params,0x1293f1);
    std::__cxx11::string::substr((ulong)((long)&directory.field_2 + 8),(ulong)params);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir,
                   &params->out_directory,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&directory.field_2 + 8));
    std::operator+(&local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                   &local_3b8,&params->algo_name);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&dir);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    mkdir.field_2._8_8_ = opendir(pcVar4);
    if ((DIR *)mkdir.field_2._8_8_ == (DIR *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 == 2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_400,"mkdir -p ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = system(pcVar4);
        if (iVar3 == -1) {
          uVar8 = std::__cxx11::string::c_str();
          uVar6 = std::__cxx11::string::c_str();
          printf("Could not create directory output/%s/%s\n",uVar8,uVar6);
        }
        local_404 = (uint)(iVar3 == -1);
        std::__cxx11::string::~string((string *)local_400);
        if (local_404 == 0) goto LAB_00113326;
      }
      else {
        uVar8 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        printf("Could not create/find directory output/%s/%s\n",uVar8,uVar6);
        local_404 = 1;
      }
    }
    else {
      closedir((DIR *)mkdir.field_2._8_8_);
LAB_00113326:
      std::operator+(&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     "/");
      std::__cxx11::to_string((string *)&f,params->sparsification_prob);
      std::operator+(&local_508,&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
      std::operator+(&local_4e8,&local_508,"-");
      std::operator+(&local_4c8,&local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&out_filename.field_2 + 8));
      std::operator+(&local_4a8,&local_4c8,"-");
      std::operator+(&local_488,&local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&directory.field_2 + 8));
      std::operator+(&local_468,&local_488,"-");
      std::operator+(&local_448,&local_468,&params->algo_name);
      std::operator+(&local_428,&local_448,".txt");
      std::__cxx11::string::operator=
                ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&f);
      std::__cxx11::string::~string((string *)&local_528);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pFVar7 = fopen(pcVar4,"w");
      local_550 = pFVar7;
      if (pFVar7 == (FILE *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",uVar8);
        local_404 = 1;
      }
      else {
        Parameters::Parameters(&local_5f8,params);
        WriteHeaderInOutput((FILE *)pFVar7,&local_5f8,cg,true_triangle_count);
        Parameters::~Parameters(&local_5f8);
        pFVar7 = local_550;
        std::__cxx11::string::string((string *)&local_618,(string *)&params->algo_name);
        Parameters::Parameters(&local_6c0,params);
        est_stats_01.mean_error_percentage = (double)est_stats._0_8_;
        est_stats_01._0_8_ = auStack_170;
        est_stats_01.median_error_percentage = est_stats.mean_error_percentage;
        est_stats_01.stddev_error_percentage = est_stats.median_error_percentage;
        est_stats_01.max_error_percentage = est_stats.stddev_error_percentage;
        est_stats_01.vertices_seen_max_percentage = est_stats.max_error_percentage;
        est_stats_01.edges_seen_max_percentage = est_stats.vertices_seen_max_percentage;
        est_stats_01.query_complexity_max_percentage = est_stats.edges_seen_max_percentage;
        WriteAlgorithmOutput((FILE *)pFVar7,&local_618,&local_6c0,est_stats_01);
        Parameters::~Parameters(&local_6c0);
        std::__cxx11::string::~string((string *)&local_618);
        WriteRawData((FILE *)local_550,(vector<Estimates,_std::allocator<Estimates>_> *)&i);
        fclose(local_550);
        local_404 = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_398);
    std::__cxx11::string::~string((string *)(directory.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(out_filename.field_2._M_local_buf + 8));
    if (local_404 != 0) goto LAB_0011386c;
  }
  local_404 = 0;
LAB_0011386c:
  std::vector<Estimates,_std::allocator<Estimates>_>::~vector
            ((vector<Estimates,_std::allocator<Estimates>_> *)&i);
  return;
}

Assistant:

void TriangleEstimator (CGraph *cg, Parameters params, Count true_triangle_count, TF func) {
    std::vector<Estimates> estimates;

    for (Count i = 0; i < params.no_of_repeat; i++) {
        auto startTime = std::chrono::high_resolution_clock::now();
        Estimates est = func(cg, params);
        auto endTime = std::chrono::high_resolution_clock::now();
//        std::cout << "Run " << i<<". Time taken for this run = " <<
//                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
//                  << " seconds" << std::endl;
        estimates.push_back(est);
    }
    EstimatorStats est_stats = GetErrorStatistics(estimates, true_triangle_count);

    // Print to console
    if (params.print_to_console) {
        WriteHeaderInOutput(stdout, params, cg, true_triangle_count);
        WriteAlgorithmOutput(stdout, params.algo_name, params, est_stats);
        WriteRawData(stdout,estimates);
    }

    // print to file
    if (params.print_to_file) {
        // take current timestamp
        std::string current_time = GetTimestamp();
        // extract the input filename
        std::string out_filename = params.filename.substr(params.filename.find_last_of("/\\") + 1);

        // create the directory output/filename/algoname, if it already does not exist
        std::string directory = params.out_directory + out_filename + "/" + params.algo_name;
        DIR* dir = opendir(directory.c_str());  // try to open the directory
        if (dir) {
            // Directory exists, go on to create a file in this location
            closedir(dir);
        }
        else if (ENOENT == errno){ // Directory does not exist, try creating one
            std::string mkdir = "mkdir -p " + directory;
            if (std::system(mkdir.c_str()) == -1) {
                printf("Could not create directory output/%s/%s\n", out_filename.c_str(), params.algo_name.c_str());
                return;
            }

        }
        else {
            printf("Could not create/find directory output/%s/%s\n",out_filename.c_str(),params.algo_name.c_str());
            return;
        }

        out_filename = directory + "/" +
                        std::to_string(params.sparsification_prob) + "-" +
                        current_time + "-" + out_filename + "-" + params.algo_name + + ".txt";
        FILE *f = fopen(out_filename.c_str(), "w");
        if (!f) {
            printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",out_filename.c_str());
            return;
        }
        WriteHeaderInOutput(f, params, cg, true_triangle_count);
        WriteAlgorithmOutput(f, params.algo_name, params, est_stats);
        WriteRawData(f, estimates);

        fclose(f);
    }

}